

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab5.c
# Opt level: O1

int FeedCompressBig1(void)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  uint n;
  byte bVar4;
  uchar *__s;
  bool bVar5;
  
  InputLength = 0;
  bVar5 = AlphabetSize != 0;
  if (bVar5) {
    n = 0;
    uVar2 = CalcFib(0);
    if (uVar2 < 0x2000001) {
      bVar4 = 0;
      do {
        __s = Input + InputLength;
        uVar2 = CalcFib(n);
        memset(__s,(uint)bVar4,(ulong)uVar2);
        uVar2 = CalcFib(n);
        InputLength = InputLength + uVar2;
        sVar1 = InputLength;
        bVar4 = bVar4 + 1;
        n = (uint)bVar4;
        bVar5 = n < AlphabetSize;
        if (AlphabetSize <= n) goto LAB_00102585;
        uVar2 = CalcFib(n);
      } while ((uchar *)(uVar2 + sVar1) < Input + 0x1ef8c81);
    }
    printf("Tester error: generated input is too large");
    if (bVar5) {
      return -1;
    }
  }
LAB_00102585:
  iVar3 = FeedCompress();
  return iVar3;
}

Assistant:

static int FeedCompressBig1(void) {
    InputLength = 0;
    for (unsigned char c = 0; c < AlphabetSize; ++c) {
        if (IsInputTooLarge(InputLength + CalcFib(c))) {
            return -1;
        }
        memset(Input + InputLength, c, CalcFib(c));
        InputLength += CalcFib(c);
    }
    return FeedCompress();
}